

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_hishelf2_init_preallocated
                    (ma_hishelf2_config *pConfig,void *pHeap,ma_hishelf2 *pFilter)

{
  void *in_RDX;
  undefined4 *in_RDI;
  double dVar1;
  ma_biquad *pBQ;
  void *pHeap_00;
  ma_biquad_config *pConfig_00;
  ma_biquad_config bqConfig_1;
  ma_biquad_config bqConfig;
  ma_result result;
  double sqrtA;
  double a;
  double S;
  double A;
  double c;
  double s;
  double w;
  undefined4 local_120;
  undefined4 local_11c;
  double local_118;
  double local_110;
  undefined1 local_e8 [80];
  undefined4 *local_98;
  ma_result local_8c;
  undefined8 local_88;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined4 *local_40;
  double local_38;
  double local_30;
  double local_28;
  undefined8 local_20;
  double local_18;
  double local_10;
  double local_8;
  
  if (in_RDX == (void *)0x0) {
    local_8c = MA_INVALID_ARGS;
  }
  else {
    local_88 = 0x40;
    local_98 = in_RDI;
    if (in_RDX != (void *)0x0) {
      memset(in_RDX,0,0x40);
    }
    if (local_98 == (undefined4 *)0x0) {
      local_8c = MA_INVALID_ARGS;
    }
    else {
      local_40 = local_98;
      local_48 = (*(double *)(local_98 + 8) * 6.283185307179586) / (double)(uint)local_98[2];
      local_18 = local_48;
      local_50 = sin(local_48);
      local_10 = local_48;
      local_8 = 1.5707963267948966 - local_48;
      local_58 = sin(local_8);
      local_28 = *(double *)(local_40 + 4) / 40.0;
      local_20 = 0x4024000000000000;
      local_60 = pow(10.0,local_28);
      local_68 = *(double *)(local_40 + 6);
      dVar1 = local_50 / 2.0;
      local_30 = (local_60 + 1.0 / local_60) * (1.0 / local_68 - 1.0) + 2.0;
      local_70 = sqrt(local_30);
      local_70 = dVar1 * local_70;
      local_38 = local_60;
      dVar1 = sqrt(local_60);
      local_78 = dVar1 * 2.0 * local_70;
      local_118 = local_60 * ((local_60 - 1.0) * local_58 + local_60 + 1.0 + local_78);
      local_110 = local_60 * -2.0 * ((local_60 + 1.0) * local_58 + (local_60 - 1.0));
      pBQ = (ma_biquad *)(local_60 * (((local_60 - 1.0) * local_58 + local_60 + 1.0) - local_78));
      pHeap_00 = (void *)(-(local_60 - 1.0) * local_58 + local_60 + 1.0 + local_78);
      pConfig_00 = (ma_biquad_config *)((-(local_60 + 1.0) * local_58 + (local_60 - 1.0)) * 2.0);
      local_120 = *local_40;
      local_11c = local_40[1];
      memcpy(local_e8,&local_120,0x38);
      local_8c = ma_biquad_init_preallocated(pConfig_00,pHeap_00,pBQ);
      if (local_8c == MA_SUCCESS) {
        local_8c = MA_SUCCESS;
      }
    }
  }
  return local_8c;
}

Assistant:

MA_API ma_result ma_hishelf2_init_preallocated(const ma_hishelf2_config* pConfig, void* pHeap, ma_hishelf2* pFilter)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pFilter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pFilter);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_hishelf2__get_biquad_config(pConfig);
    result = ma_biquad_init_preallocated(&bqConfig, pHeap, &pFilter->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}